

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O1

PVIPNode * PVIP_node_new_int(PVIPParserContext *parser,PVIP_node_type_t type,int64_t n)

{
  PVIP_category_t PVar1;
  PVIPNode *pPVar2;
  
  pPVar2 = pvip_node_alloc(parser->pvip);
  PVar1 = PVIP_node_category(type);
  if (PVar1 == PVIP_CATEGORY_INT) {
    pPVar2->type = type;
    (pPVar2->field_2).iv = n;
    pPVar2->line_number = 0;
    return pPVar2;
  }
  __assert_fail("PVIP_node_category(type) == PVIP_CATEGORY_INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                ,0x54,"PVIPNode *PVIP_node_new_int(PVIPParserContext *, PVIP_node_type_t, int64_t)")
  ;
}

Assistant:

PVIPNode * PVIP_node_new_int(PVIPParserContext* parser, PVIP_node_type_t type, int64_t n) {
    PVIPNode *node = pvip_node_alloc(parser->pvip);
    assert(PVIP_node_category(type) == PVIP_CATEGORY_INT);
    node->type = type;
    node->iv = n;
    node->line_number = 0;
    return node;
}